

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SeekAndScan<true>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,RestorePoint *restorePoint)

{
  Type TVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  TVar1 = restorePoint->m_cMinTokMultiUnits;
  this->m_currentCharacter = this->m_pchBase + TVar1 + restorePoint->m_ichMinTok;
  TVar2 = restorePoint->m_cMinLineMultiUnits;
  this->m_pchMinLine = this->m_pchBase + TVar2 + restorePoint->m_ichMinLine;
  this->m_cMinLineMultiUnits = TVar2;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = TVar1;
  ScanForcingPid(this);
  this->m_line = restorePoint->m_line;
  this->m_fHadEol = restorePoint->m_fHadEol;
  Parser::ReduceDeferredScriptLength(this->m_parser,restorePoint->lengthDecr);
  if ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits != restorePoint->m_cMultiUnits) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x919,"(this->m_cMultiUnits == restorePoint.m_cMultiUnits)",
                       "this->m_cMultiUnits == restorePoint.m_cMultiUnits");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void Scanner<EncodingPolicy>::SeekAndScan(const RestorePoint& restorePoint)
{
    this->m_currentCharacter = this->m_pchBase + restorePoint.m_ichMinTok + restorePoint.m_cMinTokMultiUnits;
    this->m_pchMinLine = this->m_pchBase + restorePoint.m_ichMinLine + restorePoint.m_cMinLineMultiUnits;
    this->m_cMinLineMultiUnits = restorePoint.m_cMinLineMultiUnits;
    this->RestoreMultiUnits(restorePoint.m_cMinTokMultiUnits);

    if (forcePid)
    {
        this->ScanForcingPid();
    }
    else
    {
        this->Scan();
    }

    this->m_line = restorePoint.m_line;
    this->m_fHadEol = restorePoint.m_fHadEol;

    this->m_parser->ReduceDeferredScriptLength(restorePoint.lengthDecr);

    Assert(this->m_cMultiUnits == restorePoint.m_cMultiUnits);
}